

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

float64 commonNaNToFloat64(commonNaNT a,float_status *status)

{
  float64 fVar1;
  
  if ((status->default_nan_mode == '\0') && (0xfff < a.high)) {
    return (ulong)(uint)a._0_4_ << 0x3f | a.high >> 0xc | 0x7ff0000000000000;
  }
  fVar1 = float64_default_nan_tricore(status);
  return fVar1;
}

Assistant:

static float64 commonNaNToFloat64(commonNaNT a, float_status *status)
{
    uint64_t mantissa = a.high >> 12;

    if (status->default_nan_mode) {
        return float64_default_nan(status);
    }

    if (mantissa) {
        return make_float64(
              (((uint64_t) a.sign) << 63)
            | UINT64_C(0x7FF0000000000000)
            | (a.high >> 12));
    } else {
        return float64_default_nan(status);
    }
}